

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O3

void __thiscall
nn::ESoinn::findMergedClasses
          (ESoinn *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *node_axis,
          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *mergeClasses)

{
  pointer *ppuVar1;
  double maxDensity;
  ConcreteLogger *this_00;
  pointer puVar2;
  mapped_type *pmVar3;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *p_Var4;
  pointer pEVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pEVar11;
  ESoinn *pEVar12;
  ulong in_R8;
  undefined1 auVar13 [8];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> neighbours;
  uint local_40;
  uint local_3c;
  uint32_t num;
  uint32_t A_axes;
  uint32_t B_axes;
  
  this_00 = log_netw;
  ppuVar1 = &neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_80 = (undefined1  [8])ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"findMergedClasses function","");
  logger::ConcreteLogger::debug(this_00,(string *)local_80,false);
  if (local_80 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_80);
  }
  A_axes = 0;
  pEVar11 = (this->m_Neurons).
            super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar5 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar5 != pEVar11) {
    uVar6 = 0;
    do {
      if (pEVar11[uVar6].m_IsDeleted == false) {
        neuron::ESoinnNeuron::getNeighbours
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,pEVar11 + uVar6);
        puVar2 = neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (auVar13 = local_80; auVar13 != (undefined1  [8])puVar2;
            auVar13 = (undefined1  [8])((long)auVar13 + 4)) {
          local_40 = *(uint *)auVar13;
          uVar6 = (ulong)local_40;
          uVar10 = (ulong)A_axes;
          if (A_axes < local_40) {
            pEVar11 = (this->m_Neurons).
                      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(this->m_Neurons).
                           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar11 >> 3) *
                    -0xf0f0f0f0f0f0f0f;
            uVar9 = uVar10;
            if ((uVar8 < uVar10 || uVar8 - uVar10 == 0) ||
               (uVar9 = uVar6, uVar8 < uVar6 || uVar8 - uVar6 == 0)) {
              uVar6 = std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar9);
LAB_00130a95:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar6);
LAB_00130aa6:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
LAB_00130ab4:
              __assert_fail("A_axes != B_axes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/neural_network/ESoinn.cpp"
                            ,0x16e,
                            "void nn::ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t> &, std::map<uint32_t, std::set<uint32_t>> &) const"
                           );
            }
            if (pEVar11[uVar10].m_CurClass != pEVar11[uVar6].m_CurClass) {
              pmVar3 = std::
                       map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       ::at(node_axis,&A_axes);
              local_3c = *pmVar3;
              pmVar3 = std::
                       map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       ::at(node_axis,&local_40);
              num = *pmVar3;
              uVar6 = (ulong)num;
              uVar10 = (ulong)local_3c;
              if (local_3c == num) goto LAB_00130ab4;
              pEVar11 = (this->m_Neurons).
                        super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar9 = ((long)(this->m_Neurons).
                             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar11 >> 3) *
                      -0xf0f0f0f0f0f0f0f;
              if (uVar9 < uVar10 || uVar9 - uVar10 == 0) goto LAB_00130aa6;
              if (uVar9 < uVar6 || uVar9 - uVar6 == 0) goto LAB_00130a95;
              uVar8 = (ulong)A_axes;
              if (uVar9 < uVar8 || uVar9 - uVar8 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar8);
LAB_00130ae4:
                uVar7 = std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,in_R8);
                if (local_80 != auVar13) {
                  operator_delete((void *)local_80);
                }
                _Unwind_Resume(uVar7);
              }
              in_R8 = (ulong)local_40;
              if (uVar9 < in_R8 || uVar9 - in_R8 == 0) goto LAB_00130ae4;
              dVar16 = pEVar11[uVar10].m_Density;
              maxDensity = pEVar11[uVar6].m_Density;
              dVar14 = pEVar11[in_R8].m_Density;
              if (pEVar11[uVar8].m_Density <= pEVar11[in_R8].m_Density) {
                dVar14 = pEVar11[uVar8].m_Density;
              }
              pEVar12 = this;
              dVar15 = meanDensity(this,local_3c);
              dVar15 = getAlpha(pEVar12,dVar16,dVar15);
              if (dVar14 <= dVar16 * dVar15) {
                pEVar12 = this;
                dVar16 = meanDensity(this,num);
                dVar16 = getAlpha(pEVar12,maxDensity,dVar16);
                if (dVar14 <= maxDensity * dVar16) goto LAB_00130a30;
              }
              p_Var4 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)std::
                          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](mergeClasses,&local_3c);
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_emplace_unique<unsigned_int_const&>(p_Var4,&num);
              p_Var4 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)std::
                          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](mergeClasses,&num);
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_emplace_unique<unsigned_int_const&>(p_Var4,&local_3c);
            }
          }
LAB_00130a30:
        }
        if (local_80 != (undefined1  [8])0x0) {
          operator_delete((void *)local_80);
        }
        uVar6 = (ulong)A_axes;
        pEVar11 = (this->m_Neurons).
                  super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pEVar5 = (this->m_Neurons).
                 super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      A_axes = (int)uVar6 + 1;
      uVar6 = (ulong)A_axes;
      uVar10 = ((long)pEVar5 - (long)pEVar11 >> 3) * -0xf0f0f0f0f0f0f0f;
    } while (uVar6 <= uVar10 && uVar10 - uVar6 != 0);
  }
  return;
}

Assistant:

void ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t>& node_axis, std::map<uint32_t, std::set<uint32_t>>& mergeClasses) const
    {
        log_netw->debug("findMergedClasses function");
        //iterate all edges
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            std::vector<uint32_t> neighbours = m_Neurons.at(i).getNeighbours();
            for (uint32_t num: neighbours)
            {
                if (num <= i)
                    continue;
                
                if (m_Neurons.at(i).curClass() != m_Neurons.at(num).curClass())
                {
                    const uint32_t A_axes = node_axis.at(i);
                    const uint32_t B_axes = node_axis.at(num);
                    assert(A_axes != B_axes);
                        
                    const double Amax = m_Neurons.at(A_axes).density();
                    const double Bmax = m_Neurons.at(B_axes).density();
                    const double min_density = std::min(m_Neurons.at(i).density(), m_Neurons.at(num).density());
                    if (min_density > getAlpha(Amax, meanDensity(A_axes)) * Amax ||
                        min_density > getAlpha(Bmax, meanDensity(B_axes)) * Bmax)
                    {
                        //Add two classes as need to merge 
                        mergeClasses[A_axes].emplace(B_axes);
                        mergeClasses[B_axes].emplace(A_axes);
                    }
                }
            }
        }
    }